

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PortConnection * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PortConnection,slang::ast::MultiPortSymbol_const&,slang::ast::InstanceSymbol_const&>
          (BumpAllocator *this,MultiPortSymbol *args,InstanceSymbol *args_1)

{
  PortConnection *this_00;
  InstanceSymbol *args_local_1;
  MultiPortSymbol *args_local;
  BumpAllocator *this_local;
  
  this_00 = (PortConnection *)allocate(this,0x38,8);
  ast::PortConnection::PortConnection(this_00,&args->super_Symbol,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }